

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  Vec_Vec_t *p;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int local_58;
  int nPiCount;
  int nPrioOffset;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vFrameCisOne;
  Vec_Int_t *vFramePPsOne;
  Vec_Int_t *vRoots;
  Vec_Vec_t *vFramePPs;
  Vec_Vec_t *vFrameCis_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  for (nPrioOffset = 0; iVar2 = Vec_PtrSize(pAig->vObjs), nPrioOffset < iVar2;
      nPrioOffset = nPrioOffset + 1) {
    pvVar6 = Vec_PtrEntry(pAig->vObjs,nPrioOffset);
    if (pvVar6 != (void *)0x0) {
      *(undefined4 *)((long)pvVar6 + 0x28) = 0xffffffff;
    }
  }
  p = Vec_VecStart(pCex->iFrame + 1);
  iVar2 = pCex->nRegs;
  iVar3 = Abc_Var2Lit(iVar2 + (pCex->iFrame + 1) * pCex->nPis,1);
  pAVar7 = Aig_ManConst1(pAig);
  (pAVar7->field_5).iData = iVar3;
  p_00 = Vec_IntAlloc(1000);
  nPiCount = 0;
  while( true ) {
    if (pCex->iFrame < nPiCount) {
      Vec_IntFree(p_00);
      pAVar7 = Aig_ManCo(pAig,pCex->iPo);
      iVar2 = Abc_LitIsCompl((pAVar7->field_5).iData);
      if (iVar2 != 0) {
        return p;
      }
      __assert_fail("Abc_LitIsCompl(pObj->iData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                    ,0x15c,
                    "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                   );
    }
    local_58 = 0;
    p_01 = Vec_VecEntryInt(vFrameCis,nPiCount);
    p_02 = Vec_VecEntryInt(p,nPiCount);
    iVar3 = Vec_IntSize(p_02);
    if (iVar3 != 0) break;
    for (nPrioOffset = 0; iVar3 = Vec_IntSize(p_01), nPrioOffset < iVar3;
        nPrioOffset = nPrioOffset + 1) {
      iVar3 = Vec_IntEntry(p_01,nPrioOffset);
      pAVar7 = Aig_ManObj(pAig,iVar3);
      iVar3 = Aig_ObjIsCi(pAVar7);
      if (iVar3 == 0) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x14e,
                      "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                     );
      }
      iVar3 = Saig_ObjIsPi(pAig,pAVar7);
      if (iVar3 == 0) {
        if (nPiCount == 0) {
          iVar3 = Saig_ObjRegId(pAig,pAVar7);
          iVar3 = Abc_Var2Lit(iVar3,0);
          Vec_IntPush(p_02,iVar3);
        }
        else {
          pAVar7 = Saig_ObjLoToLi(pAig,pAVar7);
          Vec_IntPush(p_02,(pAVar7->field_5).iData);
        }
      }
      else {
        iVar3 = pCex->nPis;
        iVar5 = pCex->nRegs;
        iVar1 = pCex->nPis;
        iVar4 = Aig_ObjCioId(pAVar7);
        iVar5 = Abc_InfoHasBit((uint *)(pCex + 1),iVar5 + nPiCount * iVar1 + iVar4);
        iVar3 = Abc_Var2Lit((iVar2 + (nPiCount + 1) * iVar3 + -1) - local_58,iVar5);
        Vec_IntPush(p_02,iVar3);
        local_58 = local_58 + 1;
      }
    }
    Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,p,nPiCount,p_00);
    nPiCount = nPiCount + 1;
  }
  __assert_fail("Vec_IntSize(vFramePPsOne) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0x14b,
                "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
               );
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis )
{
    Vec_Vec_t * vFramePPs;
    Vec_Int_t * vRoots, * vFramePPsOne, * vFrameCisOne;
    Aig_Obj_t * pObj;
    int i, f, nPrioOffset;

    // initialize phase and priority
    Aig_ManForEachObj( pAig, pObj, i )
        pObj->iData = -1;

    // set the constant node to higher priority than the flops
    vFramePPs = Vec_VecStart( pCex->iFrame+1 );
    nPrioOffset = pCex->nRegs;
    Aig_ManConst1(pAig)->iData = Abc_Var2Lit( nPrioOffset + (pCex->iFrame + 1) * pCex->nPis, 1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        int nPiCount = 0;
        // fill in PP for the CIs
        vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
        vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
        assert( Vec_IntSize(vFramePPsOne) == 0 );
        Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
        {
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(pAig, pObj) )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( nPrioOffset + (f+1) * pCex->nPis - 1 - nPiCount++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj)) ) );
            else if ( f == 0 )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( Saig_ObjRegId(pAig, pObj), 0 ) );
            else
                Vec_IntPush( vFramePPsOne, Saig_ObjLoToLi(pAig, pObj)->iData );
        }
        // compute the PP info
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
    }
    Vec_IntFree( vRoots );
    // check the output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    assert( Abc_LitIsCompl(pObj->iData) );
    return vFramePPs;
}